

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

char ** strchrexplode(char *strP,char sep)

{
  char *__s;
  size_t sVar1;
  unsigned_long uVar2;
  char *pcVar3;
  char *haystack;
  char in_SIL;
  char *in_RDI;
  char *originalstr;
  char *str;
  char **array;
  unsigned_long i;
  unsigned_long count;
  ulong local_28;
  char **local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char **)0x0;
  }
  else {
    __s = strdup(in_RDI);
    haystack = __s;
    sVar1 = strlen(__s);
    if (sVar1 == 0) {
      strfree((char *)0x107a69);
      local_8 = (char **)0x0;
    }
    else {
      uVar2 = strchrcount(haystack,in_SIL);
      local_8 = (char **)malloc((uVar2 + 2) * 8);
      memset(local_8,0,(uVar2 + 2) * 8);
      strchrrep(haystack,(char)((ulong)__s >> 0x38),(char)((ulong)__s >> 0x30));
      for (local_28 = 0; local_28 < uVar2 + 1; local_28 = local_28 + 1) {
        sVar1 = strlen(haystack);
        if (sVar1 == 0) {
          pcVar3 = (char *)malloc(1);
          local_8[local_28] = pcVar3;
          *local_8[local_28] = '\0';
        }
        else {
          pcVar3 = strdup(haystack);
          local_8[local_28] = pcVar3;
        }
        sVar1 = strlen(haystack);
        haystack = haystack + sVar1 + 1;
      }
      free(__s);
    }
  }
  return local_8;
}

Assistant:

char ** strchrexplode(char * strP, char sep)
{
	unsigned long   count, i;
	char **         array;
	char *          str;
	char *          originalstr;

	if(!strP)
		return 0;

	str = strdup(strP);
	originalstr = str;

	if(strlen(str)==0)
	{
		strfree(originalstr);
		return 0;
	}

	count = strchrcount(str, sep)+1;

	array = (char **)malloc(sizeof(char *)*(count+1));
	memset(array, 0, (sizeof(char *)*(count+1)));

	strchrrep(str, sep, '\0');

	for(i=0;i<count;i++)
	{
		if(!strlen(str))
		{
			array[i] = (char *)malloc(1);
			array[i][0] = '\0';
		}
		else
		   array[i] = strdup(str);

		str = str+strlen(str)+1;
	}

	free(originalstr);

	return array;
}